

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O0

void func_call_static_var(size_t n)

{
  size_t sVar1;
  char *pcVar2;
  ostream *poVar3;
  rep_conflict rVar4;
  double dVar5;
  double Mrps;
  double ns_per_op;
  duration<double,_std::ratio<1L,_1L>_> local_48;
  duration<double,_std::ratio<1L,_1L>_> diff;
  now_t stop;
  size_t x;
  uint32_t i;
  size_t COUNT;
  now_t start;
  size_t res;
  size_t n_local;
  
  start.__d.__r = (duration)0;
  COUNT = (size_t)now();
  for (x._4_4_ = 0; x._4_4_ < 0x10000000; x._4_4_ = x._4_4_ + 1) {
    sVar1 = f_with_static_variable((size_t *)&start,n);
    start.__d.__r = (duration)(sVar1 + (long)start.__d.__r);
  }
  diff.__r = (rep_conflict)now();
  side_effect = ((ulong)start.__d.__r & 1) + side_effect;
  ns_per_op = (double)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&diff,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)&COUNT);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_48,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&ns_per_op);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_48);
  dVar5 = (rVar4 * 1000.0 * 1000.0 * 1000.0) / 268435456.0;
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_48);
  pcVar2 = expand_name("func_call_static_var");
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
  poVar3 = std::operator<<(poVar3,": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
  poVar3 = std::operator<<(poVar3,"ns per operation,\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5 / unit);
  poVar3 = std::operator<<(poVar3," ticks,\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,((268435456.0 / rVar4) / 1000.0) / 1000.0);
  poVar3 = std::operator<<(poVar3," Mrps");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_static_var(size_t n)
{
    size_t res = 0;
    now_t start = now();
    const size_t COUNT = 0x10000000;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        size_t x = f_with_static_variable(res, n);
        res += x;
    }
    now_t stop = now();
    side_effect += res % 2;


    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}